

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

void printfmt<int,std::__cxx11::string>
               (ostream *out,char *format,int *arg,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char *pcStack_30;
  uchar ch;
  char *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  int *arg_local;
  char *format_local;
  ostream *out_local;
  
  pcStack_30 = format;
  while( true ) {
    if (*pcStack_30 == '\0') {
      return;
    }
    if ((*pcStack_30 == '{') && (pcStack_30[1] == '}')) break;
    std::operator<<(out,*pcStack_30);
    pcStack_30 = pcStack_30 + 1;
  }
  print<int>(out,arg);
  printfmt<std::__cxx11::string>(out,pcStack_30 + 2,args);
  return;
}

Assistant:

inline void printfmt(std::ostream& out, const char *format, const T& arg, const Args&... args) {
    char* s = const_cast<char*>(format);
    for (unsigned char ch; (ch = *s) != '\0'; out << *s++) {
        if (ch == '{' && *(s+1) == '}') {
            print(out, arg);
            printfmt(out, s+2, args...);
            break;
        }
    }
}